

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SamplerTest.cpp
# Opt level: O2

void __thiscall
jaegertracing::samplers::Sampler_testSamplerTags_Test::TestBody(Sampler_testSamplerTags_Test *this)

{
  long *plVar1;
  AssertionResult *pAVar2;
  pointer pTVar3;
  bool bVar4;
  char **rhs;
  long lVar5;
  char *pcVar6;
  pointer __lhs;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  int count;
  AssertionResult gtest_ar;
  allocator local_2b0 [8];
  AssertionResult gtest_ar_;
  vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> tags;
  ConstSampler constFalse;
  ConstSampler constTrue;
  ProbabilisticSampler prob;
  anon_struct_80_3_42a5a058 tests [4];
  RateLimitingSampler rate;
  
  ConstSampler::ConstSampler(&constTrue,true);
  ConstSampler::ConstSampler(&constFalse,false);
  ProbabilisticSampler::ProbabilisticSampler(&prob,0.1);
  RateLimitingSampler::RateLimitingSampler(&rate,0.1);
  tests[0]._sampler = &constTrue.super_Sampler;
  std::__cxx11::string::string((string *)&tests[0]._samplerType,"const",(allocator *)&gtest_ar);
  opentracing::v3::Value::Value(&tests[0]._samplerParam,true);
  tests[1]._sampler = &constFalse.super_Sampler;
  std::__cxx11::string::string((string *)&tests[1]._samplerType,"const",(allocator *)&gtest_ar_);
  opentracing::v3::Value::Value(&tests[1]._samplerParam,false);
  tests[2]._sampler = &prob.super_Sampler;
  std::__cxx11::string::string((string *)&tests[2]._samplerType,"probabilistic",(allocator *)&tags);
  opentracing::v3::Value::Value<double,_nullptr>(&tests[2]._samplerParam,0.1);
  tests[3]._sampler = &rate.super_Sampler;
  std::__cxx11::string::string
            ((string *)&tests[3]._samplerType,"ratelimiting",(allocator *)&local_2e8);
  opentracing::v3::Value::Value<double,_nullptr>(&tests[3]._samplerParam,0.1);
  lVar5 = 0;
  do {
    if (lVar5 == 0x140) {
LAB_001cd1f0:
      lVar5 = 0xf0;
      do {
        TestBody()::$_0::~__0((__0 *)((long)&tests[0]._sampler + lVar5));
        lVar5 = lVar5 + -0x50;
      } while (lVar5 != -0x50);
      RateLimitingSampler::~RateLimitingSampler(&rate);
      ProbabilisticSampler::~ProbabilisticSampler(&prob);
      ConstSampler::~ConstSampler(&constFalse);
      ConstSampler::~ConstSampler(&constTrue);
      return;
    }
    plVar1 = *(long **)((long)&tests[0]._sampler + lVar5);
    local_2e8 = 0;
    uStack_2e0 = 0;
    std::__cxx11::string::string((string *)&gtest_ar_,"op",local_2b0);
    (**(code **)(*plVar1 + 0x10))(&gtest_ar,plVar1,&local_2e8,&gtest_ar_);
    std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::vector
              (&tags,(vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *)
                     &gtest_ar.message_);
    std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::~vector
              ((vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *)&gtest_ar.message_
              );
    std::__cxx11::string::~string((string *)&gtest_ar_);
    pTVar3 = tags.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    count = 0;
    for (__lhs = tags.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
                 _M_impl.super__Vector_impl_data._M_start; __lhs != pTVar3; __lhs = __lhs + 1) {
      bVar4 = std::operator==(&__lhs->_key,"sampler.type");
      if (bVar4) {
        bVar4 = opentracing::v3::util::
                variant<bool,double,long,unsigned_long,std::__cxx11::string,opentracing::v3::string_view,decltype(nullptr),char_const*,opentracing::v3::util::recursive_wrapper<std::vector<opentracing::v3::Value,std::allocator<opentracing::v3::Value>>>,opentracing::v3::util::recursive_wrapper<std::unordered_map<std::__cxx11::string,opentracing::v3::Value,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,opentracing::v3::Value>>>>>
                ::is<char_const*>(&(__lhs->_value).super_variant_type);
        gtest_ar_.success_ = bVar4;
        gtest_ar_.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (!bVar4) {
          testing::Message::Message((Message *)&local_2e8);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&gtest_ar,&gtest_ar_.success_,"tag.value().is<const char*>()","false");
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_2b0,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/samplers/SamplerTest.cpp"
                     ,0x59,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)local_2b0,(Message *)&local_2e8);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2b0);
          std::__cxx11::string::~string((string *)&gtest_ar);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_2e8);
          pAVar2 = &gtest_ar_;
          goto LAB_001cd1e1;
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar_.message_);
        rhs = opentracing::v3::util::
              variant<bool,_double,_long,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::string_view,_std::nullptr_t,_const_char_*,_opentracing::v3::util::recursive_wrapper<std::vector<opentracing::v3::Value,_std::allocator<opentracing::v3::Value>_>_>,_opentracing::v3::util::recursive_wrapper<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value>_>_>_>_>
              ::get<const_char_*,_nullptr>(&(__lhs->_value).super_variant_type);
        testing::internal::CmpHelperEQ<std::__cxx11::string,char_const*>
                  ((internal *)&gtest_ar,"test._samplerType","tag.value().get<const char*>()",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&tests[0]._samplerType._M_dataplus._M_p + lVar5),rhs);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&gtest_ar_);
          if (gtest_ar.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar6 = "";
          }
          else {
            pcVar6 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_2e8,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/samplers/SamplerTest.cpp"
                     ,0x5a,pcVar6);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_2e8,(Message *)&gtest_ar_);
          goto LAB_001cd1ca;
        }
LAB_001cd041:
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar.message_);
        count = count + 1;
      }
      else {
        bVar4 = std::operator==(&__lhs->_key,"sampler.param");
        if (bVar4) {
          testing::internal::CmpHelperEQ<opentracing::v3::Value,opentracing::v3::Value>
                    ((internal *)&gtest_ar,"test._samplerParam","tag.value()",
                     (Value *)((long)&tests[0]._samplerParam.super_variant_type.type_index + lVar5),
                     &__lhs->_value);
          if (gtest_ar.success_ != false) goto LAB_001cd041;
          testing::Message::Message((Message *)&gtest_ar_);
          if (gtest_ar.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar6 = "";
          }
          else {
            pcVar6 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_2e8,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/samplers/SamplerTest.cpp"
                     ,0x5e,pcVar6);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_2e8,(Message *)&gtest_ar_);
          goto LAB_001cd1ca;
        }
      }
    }
    gtest_ar_.success_ = true;
    gtest_ar_._1_3_ = 0;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&gtest_ar,"2","count",(int *)&gtest_ar_,&count);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar6 = "";
      }
      else {
        pcVar6 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_2e8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/samplers/SamplerTest.cpp"
                 ,0x62,pcVar6);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_2e8,(Message *)&gtest_ar_);
LAB_001cd1ca:
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2e8);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_);
      pAVar2 = &gtest_ar;
LAB_001cd1e1:
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&pAVar2->message_);
      std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::~vector(&tags);
      goto LAB_001cd1f0;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::~vector(&tags);
    lVar5 = lVar5 + 0x50;
  } while( true );
}

Assistant:

TEST(Sampler, testSamplerTags)
{
    ConstSampler constTrue(true);
    ConstSampler constFalse(false);
    ProbabilisticSampler prob(0.1);
    RateLimitingSampler rate(0.1);

    const struct {
        Sampler& _sampler;
        std::string _samplerType;
        Tag::ValueType _samplerParam;
    } tests[] = { { constTrue, "const", true },
                  { constFalse, "const", false },
                  { prob, "probabilistic", 0.1 },
                  { rate, "ratelimiting", 0.1 } };

    for (auto&& test : tests) {
        const auto tags =
            test._sampler.isSampled(TraceID(), kTestOperationName).tags();
        auto count = 0;
        for (auto&& tag : tags) {
            if (tag.key() == kSamplerTypeTagKey) {
                ASSERT_TRUE(tag.value().is<const char*>());
                ASSERT_EQ(test._samplerType, tag.value().get<const char*>());
                ++count;
            }
            else if (tag.key() == kSamplerParamTagKey) {
                ASSERT_EQ(test._samplerParam, tag.value());
                ++count;
            }
        }
        ASSERT_EQ(2, count);
    }
}